

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O0

_Bool trans_fence_i(DisasContext_conflict12 *ctx,arg_fence_i *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  bool bVar1;
  TCGContext_conflict11 *tcg_ctx;
  arg_fence_i *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  bVar1 = (ctx->ext_ifencei & 1U) != 0;
  if (bVar1) {
    tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,ctx->pc_succ_insn);
    exit_tb(ctx);
    (ctx->base).is_jmp = DISAS_NORETURN;
  }
  return bVar1;
}

Assistant:

static bool trans_fence_i(DisasContext *ctx, arg_fence_i *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (!ctx->ext_ifencei) {
        return false;
    }

    /*
     * FENCE_I is a no-op in QEMU,
     * however we need to end the translation block
     */
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->pc_succ_insn);
    exit_tb(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}